

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::FunctionCallVar::FunctionCallVar
          (FunctionCallVar *this,Generator *m,shared_ptr<kratos::FunctionStmtBlock> *func_def,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args,bool has_return)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  pair<unsigned_int,_unsigned_int> pVar14;
  VarException *pVVar15;
  UserException *this_01;
  StmtException *this_02;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar16;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  undefined1 local_f0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_b8;
  undefined1 local_a0 [8];
  shared_ptr<kratos::BuiltInFunctionStmtBlock> builtin;
  undefined1 local_88 [39];
  allocator_type local_61;
  undefined1 local_60 [8];
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  
  builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = (undefined4)CONCAT71(in_register_00000081,has_return);
  p_Var1 = &ports._M_t._M_impl.super__Rb_tree_header;
  local_f0 = (undefined1  [8])p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
  aVar16.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,m,(string *)local_f0,1,1,false,Base);
  if (local_f0 != (undefined1  [8])p_Var1) {
    operator_delete((void *)local_f0,ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002ae450;
  this->func_def_ =
       (func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::_Rb_tree(&(this->args_)._M_t,&args->_M_t);
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)func_def;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_f0,
             &(((func_def->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->ports_)._M_t);
  if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&ports) {
    p_Var13 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               ::find(&args->_M_t,(key_type *)(p_Var13 + 1));
      if ((_Rb_tree_header *)cVar11._M_node == &(args->_M_t)._M_impl.super__Rb_tree_header) {
        pVVar15 = (VarException *)__cxa_allocate_exception(0x10);
        local_88._0_8_ = *(undefined8 *)(p_Var13 + 1);
        local_88._8_8_ = p_Var13[1]._M_parent;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x14;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = aVar16.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_60,(detail *)"{0} is not connected",format_str,args_00);
        local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(p_Var13 + 2);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_b8;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88,__l,(allocator_type *)local_a0);
        VarException::VarException
                  (pVVar15,(string *)local_60,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88);
        __cxa_throw(pVVar15,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                ::at(args,(key_type *)(p_Var13 + 1));
      iVar8 = (**(code **)(**(long **)(p_Var13 + 2) + 0x38))();
      iVar9 = (*(((pmVar12->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_IRNode)._vptr_IRNode[7])();
      if (iVar8 != iVar9) {
        pVVar15 = (VarException *)__cxa_allocate_exception(0x10);
        local_88._0_8_ = *(undefined8 *)(p_Var13 + 1);
        local_88._8_8_ = p_Var13[1]._M_parent;
        format_str_01.size_ = 0xd;
        format_str_01.data_ = (char *)0x19;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar16.values_;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_60,(detail *)"{0}\'s width doesn\'t match",format_str_01,args_02)
        ;
        local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(p_Var13 + 2);
        local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pmVar12->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&local_b8;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88,__l_01,(allocator_type *)local_a0);
        VarException::VarException
                  (pVVar15,(string *)local_60,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88);
        __cxa_throw(pVVar15,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((bool)*(char *)(*(long *)(p_Var13 + 2) + 0xf0) !=
          ((pmVar12->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          is_signed_) {
        pVVar15 = (VarException *)__cxa_allocate_exception(0x10);
        local_88._0_8_ = *(undefined8 *)(p_Var13 + 1);
        local_88._8_8_ = p_Var13[1]._M_parent;
        format_str_00.size_ = 0xd;
        format_str_00.data_ = (char *)0x18;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar16.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_88;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_60,(detail *)"{0}\'s sign doesn\'t match",format_str_00,args_01);
        local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(p_Var13 + 2);
        local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pmVar12->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&local_b8;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88,__l_00,(allocator_type *)local_a0);
        VarException::VarException
                  (pVVar15,(string *)local_60,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_88);
        __cxa_throw(pVVar15,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)&ports);
  }
  sVar5 = ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
  plVar2 = *(long **)(*(long *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x140);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             (*(long *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x148);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (((((builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_1_ & plVar2 == (long *)0x0) != 0) &&
       (cVar6 = (**(code **)(**(long **)ports._M_t._M_impl.super__Rb_tree_header._M_node_count +
                            0x78))(), cVar6 == '\0')) &&
      (cVar6 = (**(code **)(**(long **)sVar5 + 0x80))(), cVar6 == '\0')) &&
     (cVar6 = (**(code **)(**(long **)sVar5 + 0x88))(), cVar6 == '\0')) {
    this_02 = (StmtException *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_88 + 0x10;
    lVar4 = *(long *)(*(long *)sVar5 + 0xe8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,lVar4,*(long *)(*(long *)sVar5 + 0xf0) + lVar4);
    local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    format_str_03.size_ = 0xd;
    format_str_03.data_ = (char *)0x1d;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = aVar16.args_;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_b8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_60,(detail *)"{0} doesn\'t have return value",format_str_03,args_04);
    local_a0 = *(undefined1 (*) [8])ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_a0;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_b8,__l_02,&local_61);
    StmtException::StmtException(this_02,(string *)local_60,&local_b8);
    __cxa_throw(this_02,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_1_ != '\0') {
    cVar6 = (**(code **)(**(long **)sVar5 + 0x80))();
    if (cVar6 == '\0') {
      cVar6 = (**(code **)(**(long **)sVar5 + 0x78))();
      if (cVar6 == '\0') {
        if (plVar2 != (long *)0x0) {
          uVar10 = (**(code **)(*plVar2 + 0x38))(plVar2);
          (this->super_Var).var_width_ = uVar10;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&(this->super_Var).size_,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(plVar2 + 0x14));
          (this->super_Var).is_signed_ = SUB81(plVar2[0x1e],0);
        }
        goto LAB_00195045;
      }
      Stmt::as<kratos::DPIFunctionStmtBlock>((Stmt *)local_60);
      uVar10 = *(uint32_t *)(CONCAT44(local_60._4_4_,local_60._0_4_) + 0x180);
      if (uVar10 != 0) {
        (this->super_Var).var_width_ = uVar10;
        local_88._0_4_ = 1;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->super_Var).size_,
                   local_88);
        (this->super_Var).is_signed_ = false;
      }
    }
    else {
      Stmt::as<kratos::BuiltInFunctionStmtBlock>((Stmt *)local_a0);
      uVar10 = BuiltInFunctionStmtBlock::return_width((BuiltInFunctionStmtBlock *)local_a0);
      dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           builtin.super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      if (uVar10 != 0) {
        uVar10 = BuiltInFunctionStmtBlock::return_width((BuiltInFunctionStmtBlock *)local_a0);
        (this->super_Var).var_width_ = uVar10;
        local_60._0_4_ = 1;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->super_Var).size_,
                   local_60);
        bVar7 = BuiltInFunctionStmtBlock::is_signed((BuiltInFunctionStmtBlock *)local_a0);
        (this->super_Var).is_signed_ = bVar7;
        pVar14 = BuiltInFunctionStmtBlock::num_args((BuiltInFunctionStmtBlock *)local_a0);
        uVar3 = (args->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        if ((uVar3 < ((ulong)pVar14 & 0xffffffff)) ||
           (dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)
                   builtin.
                   super___shared_ptr<kratos::BuiltInFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr, (ulong)pVar14 >> 0x20 < uVar3)) {
          this_01 = (UserException *)__cxa_allocate_exception(0x10);
          local_88._0_8_ = local_88 + 0x10;
          lVar4 = *(long *)(*(long *)sVar5 + 0xe8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,lVar4,*(long *)(*(long *)sVar5 + 0xf0) + lVar4);
          local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
          local_b8.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
          format_str_02.size_ = 0xd;
          format_str_02.data_ = (char *)0x2b;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar16.args_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_b8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_60,(detail *)"Invalid number of arguments to function {0}",
                     format_str_02,args_03);
          UserException::UserException(this_01,(string *)local_60);
          __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    if (dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
LAB_00195045:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
               *)local_f0);
  return;
}

Assistant:

FunctionCallVar::FunctionCallVar(Generator *m, const std::shared_ptr<FunctionStmtBlock> &func_def,
                                 const std::map<std::string, std::shared_ptr<Var>> &args,
                                 bool has_return)
    : Var(m, "", 1, 1, false), func_def_(func_def.get()), args_(args) {
    // check the function call types
    auto ports = func_def->ports();
    for (auto const &[port_name, func_port] : ports) {
        if (args.find(port_name) == args.end()) {
            throw VarException(::format("{0} is not connected", port_name), {func_port.get()});
        }
        // check the port types
        auto const &arg_port = args.at(port_name);
        if (func_port->width() != arg_port->width())
            throw VarException(::format("{0}'s width doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
        if (func_port->is_signed() != arg_port->is_signed())
            throw VarException(::format("{0}'s sign doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
    }
    // compute the width and sign
    auto handle = func_def->function_handler();
    if (!handle && has_return && !func_def->is_dpi() && !func_def->is_builtin() &&
        !func_def->is_task())
        throw StmtException(::format("{0} doesn't have return value", func_def->function_name()),
                            {func_def.get()});
    if (has_return && func_def->is_builtin()) {
        auto builtin = func_def->as<BuiltInFunctionStmtBlock>();
        if (builtin->return_width()) {
            var_width_ = builtin->return_width();
            size_ = {1};
            is_signed_ = builtin->is_signed();
            auto [min_arg, max_arg] = builtin->num_args();
            auto num_arg = args.size();
            if (num_arg < min_arg || num_arg > max_arg) {
                throw UserException(fmt::format("Invalid number of arguments to function {0}",
                                                func_def->function_name()));
            }
        }
        // check num of args
    } else if (has_return && func_def->is_dpi()) {
        auto dpi = func_def->as<DPIFunctionStmtBlock>();
        if (dpi->return_width()) {
            var_width_ = dpi->return_width();
            // FIXME: always size 1?
            size_ = {1};
            is_signed_ = false;
        }
    } else if (has_return && handle != nullptr) {
        var_width_ = handle->width();
        size_ = handle->size();
        is_signed_ = handle->is_signed();
    }
}